

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O0

int Reset(WebPWorker *worker)

{
  int iVar1;
  uint uVar2;
  pthread_mutex_t *__mutex;
  long *in_RDI;
  WebPWorkerImpl *impl;
  int ok;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = 1;
  *(undefined4 *)(in_RDI + 5) = 0;
  if ((int)in_RDI[1] == 0) {
    __mutex = (pthread_mutex_t *)
              WebPSafeCalloc(CONCAT44(1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
    *in_RDI = (long)__mutex;
    if (*in_RDI == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar1 == 0) {
        iVar1 = pthread_cond_init((pthread_cond_t *)(__mutex + 1),(pthread_condattr_t *)0x0);
        if (iVar1 == 0) {
          pthread_mutex_lock(__mutex);
          iVar1 = pthread_create((pthread_t *)((long)__mutex + 0x58),(pthread_attr_t *)0x0,
                                 ThreadLoop,in_RDI);
          uVar2 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
          if (uVar2 != 0) {
            *(undefined4 *)(in_RDI + 1) = 1;
          }
          pthread_mutex_unlock(__mutex);
          if (uVar2 != 0) {
            return uVar2;
          }
          pthread_mutex_destroy(__mutex);
          pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
        }
        else {
          pthread_mutex_destroy(__mutex);
        }
      }
      WebPSafeFree((void *)0x11b88f);
      *in_RDI = 0;
      local_4 = 0;
    }
  }
  else if (1 < *(uint *)(in_RDI + 1)) {
    local_4 = Sync((WebPWorker *)0x11b8bc);
  }
  return local_4;
}

Assistant:

static int Reset(WebPWorker* const worker) {
  int ok = 1;
  worker->had_error = 0;
  if (worker->status_ < OK) {
#ifdef WEBP_USE_THREAD
    WebPWorkerImpl* const impl =
        (WebPWorkerImpl*)WebPSafeCalloc(1, sizeof(WebPWorkerImpl));
    worker->impl_ = (void*)impl;
    if (worker->impl_ == NULL) {
      return 0;
    }
    if (pthread_mutex_init(&impl->mutex_, NULL)) {
      goto Error;
    }
    if (pthread_cond_init(&impl->condition_, NULL)) {
      pthread_mutex_destroy(&impl->mutex_);
      goto Error;
    }
    pthread_mutex_lock(&impl->mutex_);
    ok = !pthread_create(&impl->thread_, NULL, ThreadLoop, worker);
    if (ok) worker->status_ = OK;
    pthread_mutex_unlock(&impl->mutex_);
    if (!ok) {
      pthread_mutex_destroy(&impl->mutex_);
      pthread_cond_destroy(&impl->condition_);
 Error:
      WebPSafeFree(impl);
      worker->impl_ = NULL;
      return 0;
    }
#else
    worker->status_ = OK;
#endif
  } else if (worker->status_ > OK) {
    ok = Sync(worker);
  }
  assert(!ok || (worker->status_ == OK));
  return ok;
}